

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  byte endch;
  byte bVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  xml_encoding xVar5;
  undefined4 extraout_var;
  long lVar6;
  xml_node_struct *pxVar7;
  xml_node_struct *pxVar8;
  xml_attribute_struct *pxVar9;
  char_t *pcVar10;
  xml_node_struct **ppxVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  xml_parse_status xVar15;
  xml_parse_status xVar16;
  char *__function;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  xml_node_type type;
  ushort *puVar20;
  ushort *puVar21;
  byte *pbVar22;
  xml_parse_result *pxVar23;
  byte *pbVar24;
  ushort uVar25;
  ulong uVar26;
  byte *pbVar27;
  byte *pbVar28;
  size_t sVar29;
  size_t __n;
  byte *pbVar30;
  byte *pbVar31;
  ulong uVar32;
  char_t *buffer;
  size_t length;
  xml_parse_result result;
  xml_parser local_d8;
  xml_node_struct *local_c0;
  byte *local_b8;
  size_t local_b0;
  ulong local_a8;
  xml_parse_result *local_a0;
  xml_node_struct *local_98;
  uint local_8c;
  byte *local_88;
  ulong uStack_80;
  xml_encoding local_78;
  undefined4 uStack_74;
  byte *local_70;
  xml_node_struct *local_68;
  undefined8 local_60;
  xml_node_struct **local_58;
  code *local_50;
  code *local_48;
  ulong local_40;
  byte *local_38;
  
  local_98 = root;
  if (size != 0 && contents == (void *)0x0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    goto LAB_00183c37;
  }
  xVar5 = get_buffer_encoding(encoding,contents,size);
  local_60 = CONCAT44(extraout_var,xVar5);
  local_b8 = (byte *)0x0;
  local_b0 = 0;
  local_a0 = __return_storage_ptr__;
  if (xVar5 == encoding_utf8) {
LAB_00183bfe:
    bVar3 = get_mutable_buffer((char_t **)&local_b8,&local_b0,contents,size,is_mutable);
LAB_00183c1c:
    __return_storage_ptr__ = local_a0;
    if (bVar3 == false) {
      xml_parse_result::xml_parse_result(local_a0);
      __return_storage_ptr__->status = status_out_of_memory;
LAB_00183c37:
      __return_storage_ptr__->offset = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    if ((xVar5 & ~encoding_utf8) != encoding_utf16_le) {
      if (xVar5 - encoding_utf32_le < 2) {
        uVar32 = size >> 2;
        if (xVar5 == encoding_utf32_le) {
          if (size < 4) {
            lVar18 = 0;
          }
          else {
            uVar17 = 0;
            lVar18 = 0;
            do {
              uVar19 = *(uint *)((long)contents + uVar17 * 4);
              lVar6 = 4;
              if ((uVar19 < 0x10000) && (lVar6 = 1, 0x7f < uVar19)) {
                lVar6 = 3 - (ulong)(uVar19 < 0x800);
              }
              lVar18 = lVar18 + lVar6;
              uVar17 = uVar17 + 1;
            } while (uVar32 != uVar17);
          }
          pbVar27 = (byte *)(*(code *)(anonymous_namespace)::
                                      xml_memory_management_function_storage<int>::allocate)();
          bVar3 = pbVar27 != (byte *)0x0;
          if (bVar3) {
            pbVar30 = pbVar27;
            if (3 < size) {
              uVar17 = 0;
              do {
                uVar19 = *(uint *)((long)contents + uVar17 * 4);
                if (uVar19 < 0x10000) {
                  pbVar30 = utf8_writer::low(pbVar30,uVar19);
                }
                else {
                  *pbVar30 = (byte)(uVar19 >> 0x12) | 0xf0;
                  pbVar30[1] = (byte)(uVar19 >> 0xc) & 0x3f | 0x80;
                  pbVar30[2] = (byte)(uVar19 >> 6) & 0x3f | 0x80;
                  pbVar30[3] = (byte)uVar19 & 0x3f | 0x80;
                  pbVar30 = pbVar30 + 4;
                }
                uVar17 = uVar17 + 1;
              } while (uVar32 != uVar17);
            }
            if (pbVar30 != pbVar27 + lVar18) {
              __function = 
              "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
              ;
              goto LAB_001853a7;
            }
            *pbVar30 = 0;
            local_b8 = pbVar27;
LAB_00184329:
            local_b0 = lVar18 + 1;
            goto LAB_0018432e;
          }
        }
        else {
          if (size < 4) {
            lVar6 = 0;
          }
          else {
            uVar17 = 0;
            lVar6 = 0;
            do {
              uVar19 = *(uint *)((long)contents + uVar17 * 4);
              uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                       uVar19 << 0x18;
              lVar18 = 4;
              if ((uVar19 < 0x10000) && (lVar18 = 1, 0x7f < uVar19)) {
                lVar18 = 3 - (ulong)(uVar19 < 0x800);
              }
              lVar6 = lVar6 + lVar18;
              uVar17 = uVar17 + 1;
            } while (uVar32 != uVar17);
          }
          uVar17 = lVar6 + 1;
          pbVar27 = (byte *)(*(code *)(anonymous_namespace)::
                                      xml_memory_management_function_storage<int>::allocate)(uVar17)
          ;
          bVar3 = pbVar27 != (byte *)0x0;
          if (bVar3) {
            pbVar30 = pbVar27;
            if (3 < size) {
              uVar26 = 0;
              do {
                uVar19 = *(uint *)((long)contents + uVar26 * 4);
                uVar13 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                         uVar19 << 0x18;
                if (uVar13 < 0x10000) {
                  pbVar30 = utf8_writer::low(pbVar30,uVar13);
                }
                else {
                  *pbVar30 = (byte)(uVar13 >> 0x12) | 0xf0;
                  pbVar30[1] = (byte)(uVar13 >> 0xc) & 0x3f | 0x80;
                  pbVar30[2] = (byte)(uVar13 >> 6) & 0x3f | 0x80;
                  pbVar30[3] = (byte)(uVar19 >> 0x18) & 0x3f | 0x80;
                  pbVar30 = pbVar30 + 4;
                }
                uVar26 = uVar26 + 1;
              } while (uVar32 != uVar26);
            }
            if (pbVar30 != pbVar27 + lVar6) {
              __function = 
              "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
              ;
              goto LAB_001853a7;
            }
            goto LAB_001842a8;
          }
        }
      }
      else {
        if (xVar5 != encoding_latin1) {
          __assert_fail("false && \"Invalid encoding\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                        ,0x8e3,
                        "bool pugi::impl::(anonymous namespace)::convert_buffer(char_t *&, size_t &, xml_encoding, const void *, size_t, bool)"
                       );
        }
        sVar29 = 0;
        __n = sVar29;
        if (size != 0) {
          do {
            __n = sVar29;
            if (*(char *)((long)contents + sVar29) < '\0') break;
            sVar29 = sVar29 + 1;
            __n = size;
          } while (size != sVar29);
        }
        if (size <= __n) goto LAB_00183bfe;
        if (size == __n) {
          lVar6 = 0;
        }
        else {
          lVar6 = 0;
          uVar32 = __n;
          do {
            lVar6 = lVar6 + (ulong)(*(byte *)((long)contents + uVar32) >> 7) + 1;
            uVar32 = uVar32 + 1;
          } while (size != uVar32);
        }
        lVar18 = __n + lVar6;
        pbVar27 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)();
        bVar3 = pbVar27 != (byte *)0x0;
        if (bVar3) {
          lVar6 = lVar6 + __n;
          memcpy(pbVar27,contents,__n);
          pbVar30 = pbVar27 + __n;
          for (; size != __n; __n = __n + 1) {
            pbVar30 = utf8_writer::low(pbVar30,(uint)*(byte *)((long)contents + __n));
          }
          if (pbVar30 != pbVar27 + lVar6) {
            __assert_fail("oend == obegin + length",
                          "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                          ,0x8bc,
                          "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                         );
          }
          *pbVar30 = 0;
          local_b8 = pbVar27;
          goto LAB_00184329;
        }
      }
      goto LAB_00183c1c;
    }
    uVar32 = size >> 1;
    lVar6 = 0;
    if (xVar5 != encoding_utf16_le) {
      uVar17 = uVar32;
      puVar20 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar12 = *puVar20 << 8;
          uVar25 = uVar12 | *puVar20 >> 8;
          if (uVar25 < 0xd800) {
            lVar18 = 3 - (ulong)(uVar25 < 0x800);
            if (uVar25 < 0x80) {
              lVar18 = 1;
            }
            lVar6 = lVar6 + lVar18;
LAB_00183ec6:
            puVar21 = puVar20 + 1;
            lVar18 = -1;
          }
          else {
            if ((~uVar25 & 0xe000) == 0) {
              lVar6 = lVar6 + 3;
              goto LAB_00183ec6;
            }
            puVar21 = puVar20 + 1;
            lVar18 = -1;
            if (((uVar17 != 1) && ((uVar12 & 0xfc00) == 0xd800)) && ((*puVar21 & 0xfc) == 0xdc)) {
              lVar6 = lVar6 + 4;
              puVar21 = puVar20 + 2;
              lVar18 = -2;
            }
          }
          uVar17 = uVar17 + lVar18;
          puVar20 = puVar21;
        } while (uVar17 != 0);
      }
      uVar17 = lVar6 + 1;
      pbVar27 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)(uVar17);
      bVar3 = pbVar27 != (byte *)0x0;
      if (bVar3) {
        pbVar30 = pbVar27;
        puVar20 = (ushort *)contents;
        if (1 < size) {
          do {
            uVar12 = *puVar20 << 8 | *puVar20 >> 8;
            uVar19 = (uint)uVar12;
            if ((uVar12 < 0xd800) || ((~uVar12 & 0xe000) == 0)) {
              pbVar30 = utf8_writer::low(pbVar30,uVar19);
              puVar21 = puVar20 + 1;
              lVar18 = -1;
            }
            else {
              puVar21 = puVar20 + 1;
              lVar18 = -1;
              if ((uVar32 != 1) && ((uVar19 & 0xfc00) == 0xd800)) {
                uVar12 = *puVar21;
                uVar13 = (uint)(ushort)(uVar12 << 8 | uVar12 >> 8);
                if ((uVar13 & 0xfc00) == 0xdc00) {
                  uVar14 = (uVar19 << 10 & 0xffc00) + 0x10000;
                  *pbVar30 = (byte)(uVar14 >> 0x12) | 0xf0;
                  pbVar30[1] = (byte)(uVar14 >> 0xc) & 0x3f | 0x80;
                  pbVar30[2] = (byte)((uVar13 & 0x3c0 | uVar19 << 10) >> 6) & 0x3f | 0x80;
                  pbVar30[3] = (byte)(uVar12 >> 8) & 0x3f | 0x80;
                  pbVar30 = pbVar30 + 4;
                  puVar21 = puVar20 + 2;
                  lVar18 = -2;
                }
              }
            }
            uVar32 = uVar32 + lVar18;
            puVar20 = puVar21;
          } while (uVar32 != 0);
        }
        if (pbVar30 != pbVar27 + lVar6) {
          __function = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_001853a7;
        }
        goto LAB_001842a8;
      }
      goto LAB_00183c1c;
    }
    uVar17 = uVar32;
    puVar20 = (ushort *)contents;
    if (1 < size) {
      do {
        uVar12 = *puVar20;
        if (uVar12 < 0xd800) {
          lVar18 = 3 - (ulong)(uVar12 < 0x800);
          if (uVar12 < 0x80) {
            lVar18 = 1;
          }
          lVar6 = lVar6 + lVar18;
LAB_00183e03:
          puVar21 = puVar20 + 1;
          lVar18 = -1;
        }
        else {
          if ((~uVar12 & 0xe000) == 0) {
            lVar6 = lVar6 + 3;
            goto LAB_00183e03;
          }
          puVar21 = puVar20 + 1;
          lVar18 = -1;
          if (((uVar17 != 1) && ((uVar12 & 0xfc00) == 0xd800)) && ((*puVar21 & 0xfc00) == 0xdc00)) {
            lVar6 = lVar6 + 4;
            puVar21 = puVar20 + 2;
            lVar18 = -2;
          }
        }
        uVar17 = uVar17 + lVar18;
        puVar20 = puVar21;
      } while (uVar17 != 0);
    }
    uVar17 = lVar6 + 1;
    pbVar27 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                                allocate)(uVar17);
    bVar3 = pbVar27 != (byte *)0x0;
    if (pbVar27 == (byte *)0x0) goto LAB_00183c1c;
    pbVar30 = pbVar27;
    puVar20 = (ushort *)contents;
    if (1 < size) {
      do {
        uVar12 = *puVar20;
        uVar19 = (uint)uVar12;
        if ((uVar12 < 0xd800) || ((~uVar12 & 0xe000) == 0)) {
          pbVar30 = utf8_writer::low(pbVar30,uVar19);
          puVar21 = puVar20 + 1;
          lVar18 = -1;
        }
        else {
          puVar21 = puVar20 + 1;
          lVar18 = -1;
          if ((uVar32 != 1) && ((uVar19 & 0xfc00) == 0xd800)) {
            uVar12 = *puVar21;
            if ((uVar12 & 0xfc00) == 0xdc00) {
              uVar13 = (uVar19 << 10 & 0xffc00) + 0x10000;
              *pbVar30 = (byte)(uVar13 >> 0x12) | 0xf0;
              pbVar30[1] = (byte)(uVar13 >> 0xc) & 0x3f | 0x80;
              pbVar30[2] = (byte)((uVar12 & 0x3c0 | uVar19 << 10) >> 6) & 0x3f | 0x80;
              pbVar30[3] = (byte)uVar12 & 0x3f | 0x80;
              pbVar30 = pbVar30 + 4;
              puVar21 = puVar20 + 2;
              lVar18 = -2;
            }
          }
        }
        uVar32 = uVar32 + lVar18;
        puVar20 = puVar21;
      } while (uVar32 != 0);
    }
    if (pbVar30 != pbVar27 + lVar6) {
      __function = 
      "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
      ;
LAB_001853a7:
      __assert_fail("oend == obegin + length",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                    ,0x88e,__function);
    }
LAB_001842a8:
    *pbVar30 = 0;
    local_b8 = pbVar27;
    local_b0 = uVar17;
  }
LAB_0018432e:
  pbVar27 = local_b8;
  if (own) {
    if (contents != (void *)0x0 && local_b8 != (byte *)contents) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (contents);
    }
    if (pbVar27 != (byte *)contents || own) {
LAB_00184370:
      *out_buffer = (char_t *)local_b8;
    }
  }
  else if (local_b8 != (byte *)contents) goto LAB_00184370;
  pxVar23 = local_a0;
  doc->buffer = (char_t *)local_b8;
  if (local_b0 != 0) {
    if (local_98->first_child == (xml_node_struct *)0x0) {
      local_68 = (xml_node_struct *)0x0;
    }
    else {
      local_68 = local_98->first_child->prev_sibling_c;
    }
    local_d8.alloc = &doc->super_xml_allocator;
    if (doc == (xml_document_struct *)0x0) {
      local_d8.alloc = (xml_allocator *)0x0;
    }
    local_d8.error_offset = (char_t *)0x0;
    local_d8.error_status = status_ok;
    endch = local_b8[local_b0 - 1];
    local_b8[local_b0 - 1] = 0;
    pbVar27 = local_b8;
    if ((*local_b8 == 0xef) && (local_b8[1] == 0xbb)) {
      pbVar27 = local_b8 + (ulong)(local_b8[2] == 0xbf) * 3;
    }
    local_38 = local_b8;
    local_58 = &local_98->first_child;
    local_40 = local_b0;
    local_a8 = local_b0 - 1;
    local_48 = *(code **)((long)&PTR_parse_simple_0023a588 + (ulong)(options >> 1 & 0x78));
    local_50 = (code *)(&PTR_parse_0023a608)[options >> 9 & 4 | options >> 4 & 3];
    local_8c = options & 0x22;
    pxVar7 = local_98;
LAB_001844c5:
    pbVar30 = pbVar27;
    if (*pbVar30 == 0) {
LAB_00185181:
      if (pxVar7 != local_98) {
        local_d8.error_status = status_end_element_mismatch;
        local_d8.error_offset = (char_t *)pbVar30;
      }
      goto LAB_00185196;
    }
    if (*pbVar30 != 0x3c) {
      lVar6 = 0;
      do {
        lVar18 = lVar6;
        bVar4 = pbVar30[lVar18];
        lVar6 = lVar18 + 1;
      } while (((anonymous_namespace)::chartype_table[bVar4] & 8) != 0);
      if ((bVar4 == 0x3c) || (bVar4 == 0)) {
        if (lVar6 == 1) {
          __assert_fail("mark != s",
                        "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                        ,0xd63,
                        "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                       );
        }
        pbVar27 = pbVar30 + lVar18;
        if (((options >> 0xb & 1) != 0 || (options & 0x408) == 0) ||
           (((options >> 10 & 1) != 0 &&
            (((bVar4 != 0x3c || (pbVar30[lVar6] != 0x2f)) ||
             (pxVar7->first_child != (xml_node_struct *)0x0)))))) goto LAB_001844c5;
      }
      pbVar27 = pbVar30 + lVar18;
      if ((options >> 0xb & 1) == 0) {
        pbVar27 = pbVar30;
      }
      pbVar30 = pbVar27;
      if (((options >> 0xc & 1) == 0) && (pxVar7->parent == (xml_node_struct *)0x0)) {
        do {
          bVar4 = *pbVar30;
          if (bVar4 == 0) goto LAB_00185181;
          pbVar30 = pbVar30 + 1;
        } while (bVar4 != 0x3c);
        goto LAB_001845b7;
      }
      if ((((options >> 0xd & 1) != 0) && (pxVar7->parent != (xml_node_struct *)0x0)) &&
         ((pxVar7->first_child == (xml_node_struct *)0x0 && (pxVar7->value == (char_t *)0x0)))) {
        pxVar7->value = (char_t *)pbVar30;
LAB_0018459e:
        pbVar30 = (byte *)(*local_50)(pbVar30);
        if (*pbVar30 == 0) goto LAB_00185181;
        goto LAB_001845b7;
      }
      pxVar7 = append_new_node(pxVar7,local_d8.alloc,node_pcdata);
      if (pxVar7 != (xml_node_struct *)0x0) {
        pxVar7->value = (char_t *)pbVar30;
        pxVar7 = pxVar7->parent;
        goto LAB_0018459e;
      }
LAB_001852c4:
      local_d8.error_offset = (char_t *)pbVar30;
      local_d8.error_status = status_out_of_memory;
      goto LAB_00185196;
    }
    pbVar30 = pbVar30 + 1;
LAB_001845b7:
    bVar4 = *pbVar30;
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar4]) {
      if (bVar4 == 0x21) {
        bVar4 = pbVar30[1];
        if (bVar4 == 0x5b) {
          if (pbVar30[2] == 0x43) {
            if (pbVar30[3] == 0x44) {
              if (pbVar30[4] == 0x41) {
                if (pbVar30[5] == 0x54) {
                  if (pbVar30[6] == 0x41) {
                    if (pbVar30[7] == 0x5b) {
                      pbVar30 = pbVar30 + 8;
                      if ((options & 4) == 0) {
                        do {
                          if (*pbVar30 == 0x5d) {
                            if (pbVar30[1] == 0x5d) {
                              if ((pbVar30[2] == 0x3e) || (endch == 0x3e && pbVar30[2] == 0))
                              goto LAB_00185108;
                            }
                          }
                          else if (*pbVar30 == 0) goto LAB_00185123;
                          pbVar30 = pbVar30 + 1;
                        } while( true );
                      }
                      pxVar8 = append_new_node(pxVar7,local_d8.alloc,node_cdata);
                      if (pxVar8 == (xml_node_struct *)0x0) {
                        local_d8.error_status = status_out_of_memory;
                        pbVar27 = (byte *)0x0;
                        local_d8.error_offset = (char_t *)pbVar30;
                      }
                      else {
                        pxVar8->value = (char_t *)pbVar30;
                        if ((options & 0x20) == 0) {
LAB_0018501e:
                          if (*pbVar30 == 0x5d) {
                            if (pbVar30[1] != 0x5d) goto LAB_00185059;
                            if ((pbVar30[2] != 0x3e) && (endch != 0x3e || pbVar30[2] != 0))
                            goto LAB_00185059;
                            *pbVar30 = 0;
LAB_00185108:
                            pbVar30 = pbVar30 + 1;
                            goto LAB_0018510b;
                          }
                          if (*pbVar30 != 0) goto LAB_00185059;
                          goto LAB_00185123;
                        }
                        pbVar30 = (byte *)strconv_cdata((char_t *)pbVar30,endch);
                        if (pbVar30 == (byte *)0x0) {
                          pbVar30 = (byte *)pxVar8->value;
LAB_00185123:
                          local_d8.error_offset = (char_t *)pbVar30;
                          local_d8.error_status = status_bad_cdata;
                          pbVar27 = (byte *)0x0;
                        }
                        else {
LAB_0018510b:
                          pbVar27 = pbVar30 + (ulong)(pbVar30[1] == 0x3e) + 1;
                        }
                      }
                      goto LAB_00184fc0;
                    }
                    local_d8.error_offset = (char_t *)(pbVar30 + 7);
                  }
                  else {
                    local_d8.error_offset = (char_t *)(pbVar30 + 6);
                  }
                }
                else {
                  local_d8.error_offset = (char_t *)(pbVar30 + 5);
                }
              }
              else {
                local_d8.error_offset = (char_t *)(pbVar30 + 4);
              }
            }
            else {
              local_d8.error_offset = (char_t *)(pbVar30 + 3);
            }
          }
          else {
            local_d8.error_offset = (char_t *)(pbVar30 + 2);
          }
LAB_00184fb5:
          local_d8.error_status = status_bad_cdata;
          goto LAB_00184fbd;
        }
        if (bVar4 != 0x44) {
          if (bVar4 != 0x2d) goto LAB_001849b7;
          if (pbVar30[2] == 0x2d) {
            pbVar30 = pbVar30 + 3;
            pxVar8 = pxVar7;
            if ((options & 2) == 0) {
LAB_00184775:
              if (local_8c != 0x22) {
                do {
                  if (*pbVar30 == 0x2d) {
                    if (pbVar30[1] == 0x2d) {
                      if ((pbVar30[2] == 0x3e) || (endch == 0x3e && pbVar30[2] == 0)) {
                        if ((options & 2) != 0) {
                          *pbVar30 = 0;
                        }
                        pbVar27 = pbVar30 + (ulong)(pbVar30[2] == 0x3e) + 2;
                        goto LAB_00184fc0;
                      }
                    }
                  }
                  else if (*pbVar30 == 0) goto LAB_00184af0;
                  pbVar30 = pbVar30 + 1;
                } while( true );
              }
              local_88 = (byte *)0x0;
              uStack_80 = 0;
              local_c0 = pxVar8;
LAB_0018478d:
              do {
                pbVar27 = pbVar30;
                if (((anonymous_namespace)::chartype_table[*pbVar30] & 0x20) == 0) {
                  if (((anonymous_namespace)::chartype_table[pbVar30[1]] & 0x20) != 0) {
                    pbVar27 = pbVar30 + 1;
                    goto LAB_0018488a;
                  }
                  if (((anonymous_namespace)::chartype_table[pbVar30[2]] & 0x20) != 0) {
                    pbVar27 = pbVar30 + 2;
                    goto LAB_0018488a;
                  }
                  bVar3 = ((anonymous_namespace)::chartype_table[pbVar30[3]] & 0x20) == 0;
                  if (bVar3) {
                    pbVar27 = pbVar30 + 4;
                  }
                  else {
                    pbVar27 = pbVar30 + 3;
                  }
                }
                else {
LAB_0018488a:
                  bVar3 = false;
                }
                pbVar30 = pbVar27;
              } while (bVar3);
              bVar4 = *pbVar27;
              if (bVar4 == 0xd) {
                pbVar30 = pbVar27 + 1;
                *pbVar27 = 10;
                if (pbVar27[1] == 10) {
                  if (local_88 != (byte *)0x0) {
                    if (pbVar30 < local_88) {
                      __assert_fail("s >= end",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                                    ,0x974,
                                    "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)"
                                   );
                    }
                    memmove(local_88 + -uStack_80,local_88,(long)pbVar30 - (long)local_88);
                  }
                  pbVar30 = pbVar27 + 2;
                  uStack_80 = uStack_80 + 1;
                  local_88 = pbVar30;
                }
                goto LAB_0018478d;
              }
              if (bVar4 == 0x2d) {
                if ((pbVar27[1] == 0x2d) &&
                   ((pbVar27[2] == 0x3e || (endch == 0x3e && pbVar27[2] == 0)))) {
                  pcVar10 = gap::flush((gap *)&local_88,(char_t *)pbVar27);
                  *pcVar10 = '\0';
                  pbVar27 = pbVar27 + (ulong)(pbVar27[2] == 0x3e) + 2;
                  goto LAB_00184bbf;
                }
              }
              else if (bVar4 == 0) goto LAB_00184bbc;
              pbVar30 = pbVar27 + 1;
              goto LAB_0018478d;
            }
            pxVar8 = append_new_node(pxVar7,local_d8.alloc,node_comment);
            if (pxVar8 != (xml_node_struct *)0x0) {
              pxVar8->value = (char_t *)pbVar30;
              goto LAB_00184775;
            }
            local_d8.error_status = status_out_of_memory;
            pbVar27 = (byte *)0x0;
            local_d8.error_offset = (char_t *)pbVar30;
            goto LAB_00184fc0;
          }
          pbVar30 = pbVar30 + 2;
          goto LAB_00184af0;
        }
        if ((((pbVar30[2] != 0x4f) || (pbVar30[3] != 0x43)) || (pbVar30[4] != 0x54)) ||
           ((pbVar30[5] != 0x59 || (pbVar30[6] != 0x50)))) {
LAB_001849b7:
          local_d8.error_offset = (char_t *)(pbVar30 + 1);
          if ((endch != 0x2d) || (pbVar30 = (byte *)local_d8.error_offset, bVar4 != 0)) {
            if ((endch == 0x5b) && (bVar4 == 0)) goto LAB_00184fb5;
            local_d8.error_status = status_unrecognized_tag;
            goto LAB_00184fbd;
          }
          goto LAB_00184af0;
        }
        if ((pbVar30[7] != 0x45) && (endch != 0x45 || pbVar30[7] != 0)) goto LAB_001849b7;
        if (pxVar7->parent != (xml_node_struct *)0x0) {
          local_d8.error_status = status_bad_doctype;
          local_d8.error_offset = (char_t *)(pbVar30 + -1);
          goto LAB_00184fbd;
        }
        pbVar27 = (byte *)xml_parser::parse_doctype_group(&local_d8,(char_t *)(pbVar30 + -1),endch);
        if (pbVar27 == (byte *)0x0) {
LAB_0018514d:
          pbVar27 = (byte *)0x0;
        }
        else {
          bVar4 = *pbVar27;
          if ((bVar4 != 0x3e) && (endch != 0x3e || bVar4 != 0)) {
            __assert_fail("(*s == 0 && endch == \'>\') || *s == \'>\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                          ,0xc39,
                          "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_exclamation(char_t *, xml_node_struct *, unsigned int, char_t)"
                         );
          }
          if (bVar4 != 0) {
            *pbVar27 = 0;
            pbVar27 = pbVar27 + 1;
          }
          if ((options >> 9 & 1) != 0) {
            pbVar30 = pbVar30 + 7;
            do {
              pbVar28 = pbVar30 + 1;
              pbVar30 = pbVar30 + 1;
            } while (((anonymous_namespace)::chartype_table[*pbVar28] & 8) != 0);
            pxVar8 = append_new_node(pxVar7,local_d8.alloc,node_doctype);
            if (pxVar8 == (xml_node_struct *)0x0) {
              local_d8.error_status = status_out_of_memory;
              local_d8.error_offset = (char_t *)pbVar27;
              goto LAB_0018514d;
            }
            pxVar8->value = (char_t *)pbVar30;
          }
        }
        goto LAB_00184fc0;
      }
      if (bVar4 == 0x3f) {
        pbVar27 = pbVar30 + 1;
        if (-1 < (char)(anonymous_namespace)::chartype_table[pbVar30[1]]) goto LAB_00184708;
        lVar6 = 4;
        pbVar28 = pbVar30 + 3;
        pbVar31 = pbVar27;
        do {
          pbVar24 = pbVar31;
          pbVar22 = pbVar28;
          pbVar31 = pbVar24 + 1;
          lVar6 = lVar6 + -1;
          pbVar28 = pbVar22 + 1;
        } while (((anonymous_namespace)::chartype_table[*pbVar24] & 0x40) != 0);
        if (*pbVar24 == 0) {
LAB_00184ad5:
          local_d8.error_offset = (char_t *)pbVar24;
          local_d8.error_status = status_bad_pi;
          pbVar27 = (byte *)0x0;
        }
        else {
          if (((pbVar30[1] & 0xdf) == 0x58) && ((pbVar30[2] & 0xdf) == 0x4d)) {
            bVar3 = lVar6 == 0 && (pbVar30[3] & 0xdf) == 0x4c;
          }
          else {
            bVar3 = false;
          }
          uVar19 = 1;
          if (bVar3) {
            uVar19 = 0x100;
          }
          if ((options & uVar19) == 0) {
            do {
              if (*pbVar24 == 0x3f) {
                bVar4 = pbVar24[1];
                if ((bVar4 == 0x3e) || (endch == 0x3e && bVar4 == 0)) {
                  pbVar27 = pbVar24 + (ulong)(bVar4 == 0x3e) + 1;
                  goto LAB_00184d7d;
                }
              }
              else if (*pbVar24 == 0) goto LAB_00184ba3;
              pbVar24 = pbVar24 + 1;
            } while( true );
          }
          if (bVar3) {
            if (pxVar7->parent != (xml_node_struct *)0x0) goto LAB_00184ad5;
            type = node_declaration;
          }
          else {
            type = node_pi;
          }
          local_c0 = pxVar7;
          local_70 = pbVar27;
          pxVar8 = append_new_node(pxVar7,local_d8.alloc,type);
          pxVar7 = local_c0;
          if (pxVar8 == (xml_node_struct *)0x0) {
            local_d8.error_status = status_out_of_memory;
            pbVar27 = (byte *)0x0;
            local_d8.error_offset = (char_t *)pbVar24;
          }
          else {
            pxVar8->name = (char_t *)local_70;
            bVar4 = *pbVar24;
            *pbVar24 = 0;
            if ((ulong)bVar4 != 0x3f) {
              pbVar27 = pbVar24;
              pbVar24 = pbVar31;
              if (((anonymous_namespace)::chartype_table[bVar4] & 8) != 0) {
                do {
                  pbVar28 = pbVar22;
                  pbVar30 = pbVar27 + 1;
                  pbVar27 = pbVar27 + 1;
                  pbVar22 = pbVar28 + 1;
                } while (((anonymous_namespace)::chartype_table[*pbVar30] & 8) != 0);
                do {
                  if (pbVar28[-1] == 0x3f) {
                    if ((*pbVar28 == 0x3e) || (endch == 0x3e && *pbVar28 == 0)) {
                      if (bVar3) {
                        pbVar28[-1] = 0x2f;
                        pxVar7 = pxVar8;
                      }
                      else {
                        pxVar8->value = (char_t *)pbVar27;
                        pxVar7 = pxVar8->parent;
                        pbVar28[-1] = 0;
                        pbVar27 = pbVar28 + (*pbVar28 == 0x3e);
                      }
                      goto LAB_00184d7d;
                    }
                  }
                  else if (pbVar28[-1] == 0) goto LAB_00184f81;
                  pbVar28 = pbVar28 + 1;
                } while( true );
              }
              goto LAB_00184ad5;
            }
            bVar4 = *pbVar31;
            if ((bVar4 != 0x3e) && (pbVar27 = pbVar31, endch != 0x3e || bVar4 != 0))
            goto LAB_00184708;
            pbVar27 = pbVar31 + (bVar4 == 0x3e);
            pxVar7 = pxVar8->parent;
          }
        }
        goto LAB_00184d7d;
      }
      if (bVar4 != 0x2f) {
        local_d8.error_status = (endch == 0x3f && bVar4 == 0) + status_unrecognized_tag;
        local_d8.error_offset = (char_t *)pbVar30;
        goto LAB_00185196;
      }
      pbVar30 = pbVar30 + 1;
      pbVar28 = (byte *)pxVar7->name;
      xVar16 = status_end_element_mismatch;
      xVar15 = status_end_element_mismatch;
      pbVar31 = pbVar30;
      pbVar27 = pbVar30;
      if (pbVar28 != (byte *)0x0) {
LAB_001845f6:
        bVar4 = *pbVar27;
        xVar16 = xVar15;
        if (((anonymous_namespace)::chartype_table[bVar4] & 0x40) != 0) goto code_r0x00184604;
        if (*pbVar28 == 0) {
          pxVar7 = pxVar7->parent;
          do {
            pbVar31 = pbVar27;
            bVar4 = *pbVar31;
            pbVar27 = pbVar31 + 1;
          } while (((anonymous_namespace)::chartype_table[bVar4] & 8) != 0);
          pbVar30 = pbVar31;
          if (bVar4 != 0) {
            if (bVar4 == 0x3e) {
              bVar3 = true;
              goto LAB_00184c04;
            }
            xVar16 = status_bad_end_element;
            goto LAB_00184bf6;
          }
          bVar3 = true;
          pbVar27 = pbVar31;
          xVar16 = status_bad_end_element;
          if (endch != 0x3e) goto LAB_00184bf6;
          goto LAB_00184c04;
        }
        pbVar31 = pbVar27;
        if (((bVar4 == 0) && (*pbVar28 == endch)) && (pbVar28[1] == 0)) {
          pbVar30 = pbVar27;
          xVar16 = status_bad_end_element;
        }
      }
LAB_00184bf6:
      bVar3 = false;
      pbVar27 = pbVar31;
      local_d8.error_offset = (char_t *)pbVar30;
      local_d8.error_status = xVar16;
LAB_00184c04:
      if (!bVar3) goto LAB_00185196;
      goto LAB_001844c5;
    }
    pxVar7 = append_new_node(pxVar7,local_d8.alloc,node_element);
    if (pxVar7 == (xml_node_struct *)0x0) goto LAB_001852c4;
    pxVar7->name = (char_t *)pbVar30;
    do {
      if (((anonymous_namespace)::chartype_table[*pbVar30] & 0x40) == 0) {
LAB_00184687:
        bVar4 = 0;
      }
      else {
        if (((anonymous_namespace)::chartype_table[pbVar30[1]] & 0x40) == 0) {
          pbVar30 = pbVar30 + 1;
          goto LAB_00184687;
        }
        if (((anonymous_namespace)::chartype_table[pbVar30[2]] & 0x40) == 0) {
          pbVar30 = pbVar30 + 2;
          goto LAB_00184687;
        }
        bVar4 = ((anonymous_namespace)::chartype_table[pbVar30[3]] & 0x40) >> 6;
        if (bVar4 == 0) {
          pbVar30 = pbVar30 + 3;
        }
        else {
          pbVar30 = pbVar30 + 4;
        }
      }
    } while (bVar4 != 0);
    bVar4 = *pbVar30;
    uVar32 = (ulong)bVar4;
    pbVar27 = pbVar30 + 1;
    *pbVar30 = 0;
    if (uVar32 == 0x3e) goto LAB_001844c5;
    if (((anonymous_namespace)::chartype_table[uVar32] & 8) != 0) goto LAB_00184d9e;
    if (uVar32 == 0) {
      pbVar27 = pbVar30;
      if (endch == 0x3e) goto LAB_001844c5;
    }
    else {
      pbVar30 = pbVar27;
      if (bVar4 != 0x2f) goto LAB_001852f5;
      bVar4 = *pbVar27;
      if ((bVar4 == 0x3e) || (endch == 0x3e && bVar4 == 0)) {
        pxVar7 = pxVar7->parent;
        pbVar27 = pbVar27 + (bVar4 == 0x3e);
        goto LAB_001844c5;
      }
    }
    goto LAB_001852f5;
  }
  xml_parse_result::xml_parse_result(local_a0);
  pxVar23->status = ~options >> 8 & status_no_document_element;
  pxVar23->offset = 0;
  xVar5 = (xml_encoding)local_60;
  goto LAB_00185287;
LAB_00185059:
  pbVar30 = pbVar30 + 1;
  goto LAB_0018501e;
LAB_00184bbc:
  pbVar27 = (byte *)0x0;
LAB_00184bbf:
  if (pbVar27 == (byte *)0x0) {
    pbVar30 = (byte *)local_c0->value;
LAB_00184af0:
    local_d8.error_offset = (char_t *)pbVar30;
    local_d8.error_status = status_bad_comment;
LAB_00184fbd:
    pbVar27 = (byte *)0x0;
  }
LAB_00184fc0:
  if (pbVar27 == (byte *)0x0) goto LAB_00185196;
  goto LAB_001844c5;
LAB_00184ba3:
  local_d8.error_status = status_bad_pi;
  pbVar27 = (byte *)0x0;
  local_d8.error_offset = (char_t *)pbVar24;
  goto LAB_00184d7d;
LAB_00184f81:
  pbVar27 = pbVar28 + -1;
LAB_00184708:
  local_d8.error_offset = (char_t *)pbVar27;
  local_d8.error_status = status_bad_pi;
  pbVar27 = (byte *)0x0;
LAB_00184d7d:
  if (pbVar27 == (byte *)0x0) goto LAB_00185196;
  if (pxVar7 == (xml_node_struct *)0x0) {
    __assert_fail("cursor",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                  ,0xd4f,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
  if ((pxVar7->header & 0xf) != 7) goto LAB_001844c5;
LAB_00184d9e:
  while( true ) {
    do {
      pbVar30 = pbVar27;
      bVar4 = *pbVar30;
      pbVar27 = pbVar30 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar4] & 8) != 0);
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar4]) break;
    pxVar9 = append_new_attribute(pxVar7,local_d8.alloc);
    if (pxVar9 == (xml_attribute_struct *)0x0) {
      pbVar27 = pbVar30;
      xVar16 = status_out_of_memory;
LAB_00184ead:
      bVar3 = false;
      local_d8.error_offset = (char_t *)pbVar27;
      local_d8.error_status = xVar16;
    }
    else {
      pxVar9->name = (char_t *)pbVar30;
      do {
        if (((anonymous_namespace)::chartype_table[*pbVar30] & 0x40) == 0) {
LAB_00184e2a:
          bVar4 = 0;
        }
        else {
          if (((anonymous_namespace)::chartype_table[pbVar30[1]] & 0x40) == 0) {
            pbVar30 = pbVar30 + 1;
            goto LAB_00184e2a;
          }
          if (((anonymous_namespace)::chartype_table[pbVar30[2]] & 0x40) == 0) {
            pbVar30 = pbVar30 + 2;
            goto LAB_00184e2a;
          }
          bVar4 = ((anonymous_namespace)::chartype_table[pbVar30[3]] & 0x40) >> 6;
          if (bVar4 == 0) {
            pbVar30 = pbVar30 + 3;
          }
          else {
            pbVar30 = pbVar30 + 4;
          }
        }
      } while (bVar4 != 0);
      bVar4 = *pbVar30;
      *pbVar30 = 0;
      while (pbVar30 = pbVar30 + 1, ((anonymous_namespace)::chartype_table[bVar4] & 8) != 0) {
        bVar4 = *pbVar30;
      }
      pbVar27 = pbVar30;
      pbVar28 = pbVar30;
      xVar16 = status_bad_attribute;
      if (bVar4 != 0x3d) goto LAB_00184ead;
      do {
        pbVar30 = pbVar28;
        bVar4 = *pbVar30;
        pbVar28 = pbVar30 + 1;
      } while (((anonymous_namespace)::chartype_table[bVar4] & 8) != 0);
      xVar16 = status_bad_attribute;
      if ((bVar4 != 0x22) && (pbVar27 = pbVar30, bVar4 != 0x27)) goto LAB_00184ead;
      pxVar9->value = (char_t *)pbVar28;
      pbVar30 = (byte *)(*local_48)(pbVar28,(int)(char)bVar4);
      if (pbVar30 == (byte *)0x0) {
        pbVar30 = (byte *)0x0;
        pbVar27 = (byte *)pxVar9->value;
        goto LAB_00184ead;
      }
      bVar3 = true;
      pbVar27 = pbVar30;
      xVar16 = status_bad_attribute;
      if ((char)(anonymous_namespace)::chartype_table[*pbVar30] < '\0') goto LAB_00184ead;
    }
    pbVar27 = pbVar30;
    if (!bVar3) goto LAB_00185196;
  }
  if (bVar4 == 0x3e) goto LAB_001844c5;
  if (bVar4 == 0x2f) {
    if (*pbVar27 == 0x3e) {
      pxVar7 = pxVar7->parent;
      pbVar27 = pbVar30 + 2;
      goto LAB_001844c5;
    }
    pbVar30 = pbVar27;
    if ((endch == 0x3e) && (*pbVar27 == 0)) {
      pxVar7 = pxVar7->parent;
      goto LAB_001844c5;
    }
  }
  else if ((endch == 0x3e) && (pbVar27 = pbVar30, bVar4 == 0)) goto LAB_001844c5;
LAB_001852f5:
  local_d8.error_offset = (char_t *)pbVar30;
  local_d8.error_status = status_bad_start_element;
  goto LAB_00185196;
code_r0x00184604:
  bVar1 = *pbVar28;
  pbVar31 = pbVar27 + 1;
  pbVar27 = pbVar27 + 1;
  pbVar28 = pbVar28 + 1;
  if (bVar4 != bVar1) goto LAB_00184bf6;
  goto LAB_001845f6;
LAB_00185196:
  xVar16 = local_d8.error_status;
  uVar32 = (long)local_d8.error_offset - (long)local_38;
  if ((byte *)local_d8.error_offset == (byte *)0x0) {
    uVar32 = 0;
  }
  xml_parse_result::xml_parse_result((xml_parse_result *)&local_88);
  uVar2 = local_60;
  pxVar23 = local_a0;
  local_88 = (byte *)CONCAT44(local_88._4_4_,xVar16);
  uStack_80 = uVar32;
  if (((long)uVar32 < 0) || (local_40 < uVar32)) {
    __assert_fail("result.offset >= 0 && static_cast<size_t>(result.offset) <= length",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                  ,0xdc8,
                  "static xml_parse_result pugi::impl::(anonymous namespace)::xml_parser::parse(char_t *, size_t, xml_document_struct *, xml_node_struct *, unsigned int)"
                 );
  }
  if (xVar16 == status_ok) {
    if (endch != 0x3c) {
      if ((options >> 0xc & 1) == 0) {
        ppxVar11 = &local_68->next_sibling;
        if (local_68 == (xml_node_struct *)0x0) {
          ppxVar11 = local_58;
        }
        for (pxVar7 = *ppxVar11; pxVar7 != (xml_node_struct *)0x0; pxVar7 = pxVar7->next_sibling) {
          if ((pxVar7->header & 0xf) == 2) goto LAB_0018526a;
        }
        if (pxVar7 == (xml_node_struct *)0x0) {
          xml_parse_result::xml_parse_result(local_a0);
          pxVar23->status = status_no_document_element;
          uStack_80 = local_a8;
          goto LAB_00185283;
        }
      }
      goto LAB_0018526a;
    }
    xml_parse_result::xml_parse_result(local_a0);
    pxVar23->status = status_unrecognized_tag;
    uStack_80 = local_a8;
  }
  else {
    if (((0 < (long)uVar32) && (uVar32 == local_a8)) && (endch == 0)) {
      uStack_80 = uVar32 - 1;
    }
LAB_0018526a:
    local_a0->encoding = local_78;
    *(undefined4 *)&local_a0->field_0x14 = uStack_74;
    *(byte **)local_a0 = local_88;
  }
LAB_00185283:
  xVar5 = (xml_encoding)uVar2;
  pxVar23->offset = uStack_80;
LAB_00185287:
  pxVar23->encoding = xVar5;
  return pxVar23;
}

Assistant:

PUGI__FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// get private buffer
		char_t* buffer = 0;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}